

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O0

void __thiscall
lts2::LBDOperator::updateRingCells
          (LBDOperator *this,IntegratingCell *cells,int numberOfCells,float detectorSize,
          float ringRadius,float omega,float phi)

{
  int iVar1;
  int iVar2;
  IntegratingCell *pIVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  double cellArea;
  int ymax;
  int ymin;
  int xmax;
  int xmin;
  float yc;
  float xc;
  float theta;
  IntegratingCell *currentCell;
  int cellIdx;
  float yoffset;
  float xoffset;
  float phi_local;
  float omega_local;
  float ringRadius_local;
  float detectorSize_local;
  int numberOfCells_local;
  IntegratingCell *cells_local;
  LBDOperator *this_local;
  
  iVar1 = (this->_patchSize).width;
  iVar2 = (this->_patchSize).height;
  for (currentCell._0_4_ = 0; (int)currentCell < numberOfCells;
      currentCell._0_4_ = (int)currentCell + 1) {
    pIVar3 = cells + (int)currentCell;
    fVar5 = (float)(int)currentCell * omega + phi;
    dVar7 = std::cos((double)(ulong)(uint)fVar5);
    fVar6 = ringRadius * SUB84(dVar7,0) + (float)(iVar1 / 2);
    dVar7 = std::sin((double)(ulong)(uint)fVar5);
    fVar5 = ringRadius * SUB84(dVar7,0) + (float)(iVar2 / 2);
    lVar4 = lrintf(fVar6 - detectorSize);
    local_84 = (int)lVar4;
    lVar4 = lrintf(fVar6 + detectorSize);
    local_88 = (int)lVar4 + 1;
    lVar4 = lrintf(fVar5 - detectorSize);
    local_8c = (int)lVar4;
    lVar4 = lrintf(fVar5 + detectorSize);
    local_90 = (int)lVar4 + 1;
    if (local_84 < 0) {
      local_84 = 0;
    }
    if ((this->_patchSize).width < local_88) {
      local_88 = (this->_patchSize).width;
    }
    if (local_8c < 0) {
      local_8c = 0;
    }
    if ((this->_patchSize).height < local_90) {
      local_90 = (this->_patchSize).height;
    }
    pIVar3->xmin = local_84;
    pIVar3->xmax = local_88;
    pIVar3->ymin = local_8c;
    pIVar3->ymax = local_90;
    pIVar3->scaleFactor = 1.0 / (double)((local_88 - local_84) * (local_90 - local_8c));
  }
  return;
}

Assistant:

void lts2::LBDOperator::updateRingCells(lbd::IntegratingCell* cells, int numberOfCells, float detectorSize, float ringRadius, float omega, float phi)
{
    float xoffset = _patchSize.width / 2;
    float yoffset = _patchSize.height / 2;
    
    for (int cellIdx = 0; cellIdx < numberOfCells; ++cellIdx)
    {
      lbd::IntegratingCell* currentCell = cells + cellIdx;
        
        float theta = cellIdx * omega + phi;
        
        float xc = xoffset + ringRadius * std::cos(theta);
        float yc = yoffset + ringRadius * std::sin(theta);
        
        int xmin =  (int)lrintf(xc-detectorSize);
        int xmax =  (int)lrintf(xc+detectorSize) + 1;
        int ymin =  (int)lrintf(yc-detectorSize);
        int ymax =  (int)lrintf(yc+detectorSize) + 1;
        
        xmin = MAX(xmin, 0);
        xmax = MIN(xmax, _patchSize.width);
        ymin = MAX(ymin, 0);
        ymax = MIN(ymax, _patchSize.height);
        
        currentCell->xmin = xmin;
        currentCell->xmax = xmax;
        currentCell->ymin = ymin;
        currentCell->ymax = ymax;
        
        double cellArea = double((xmax - xmin)*(ymax - ymin));
        currentCell->scaleFactor = 1.0 / cellArea;
    }
}